

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_AllRgbWidget.cpp
# Opt level: O0

void AllRgbWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  int *result;
  QImage local_68 [40];
  QImage local_40 [24];
  QObject *local_28;
  AllRgbWidget *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    _t = (AllRgbWidget *)_a;
    _a_local._0_4_ = _id;
    _a_local._4_4_ = _c;
    __id_local = _o;
    switch(_id) {
    case 0:
      QImage::QImage(local_40,(QImage *)_a[1]);
      onTargetUpdated((AllRgbWidget *)_o,local_40);
      QImage::~QImage(local_40);
      break;
    case 1:
      QImage::QImage(local_68,(QImage *)_a[1]);
      onAllRgbUpdated((AllRgbWidget *)_o,local_68);
      QImage::~QImage(local_68);
      break;
    case 2:
      onIterationsChanged((AllRgbWidget *)_o,*_a[1]);
      break;
    case 3:
      onImprovementsChanged((AllRgbWidget *)_o,*_a[1]);
      break;
    case 4:
      onResetPixelsRequested((AllRgbWidget *)_o);
      break;
    case 5:
      onLoadPixelsRequested((AllRgbWidget *)_o);
      break;
    case 6:
      onResetViewRequested((AllRgbWidget *)_o);
      break;
    case 7:
      onStartRequested((AllRgbWidget *)_o);
      break;
    case 8:
      onStopRequested((AllRgbWidget *)_o);
      break;
    case 9:
      onSaveImageRequested((AllRgbWidget *)_o);
      break;
    case 10:
      QImage::QImage((QImage *)&result,(QImage *)_a[1]);
      onUpdateFromAlgorithm((AllRgbWidget *)_o,(QImage *)&result);
      QImage::~QImage((QImage *)&result);
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == onTargetUpdated && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == onAllRgbUpdated && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == onIterationsChanged &&
            (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
        else {
          pcVar2 = *_a[1];
          if (pcVar2 == onImprovementsChanged &&
              (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
            *puVar1 = 3;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void AllRgbWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<AllRgbWidget *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->onTargetUpdated((*reinterpret_cast< std::add_pointer_t<QImage>>(_a[1]))); break;
        case 1: _t->onAllRgbUpdated((*reinterpret_cast< std::add_pointer_t<QImage>>(_a[1]))); break;
        case 2: _t->onIterationsChanged((*reinterpret_cast< std::add_pointer_t<quint64>>(_a[1]))); break;
        case 3: _t->onImprovementsChanged((*reinterpret_cast< std::add_pointer_t<quint64>>(_a[1]))); break;
        case 4: _t->onResetPixelsRequested(); break;
        case 5: _t->onLoadPixelsRequested(); break;
        case 6: _t->onResetViewRequested(); break;
        case 7: _t->onStartRequested(); break;
        case 8: _t->onStopRequested(); break;
        case 9: _t->onSaveImageRequested(); break;
        case 10: _t->onUpdateFromAlgorithm((*reinterpret_cast< std::add_pointer_t<QImage>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (AllRgbWidget::*)(QImage );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AllRgbWidget::onTargetUpdated)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (AllRgbWidget::*)(QImage );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AllRgbWidget::onAllRgbUpdated)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (AllRgbWidget::*)(quint64 );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AllRgbWidget::onIterationsChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (AllRgbWidget::*)(quint64 );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&AllRgbWidget::onImprovementsChanged)) {
                *result = 3;
                return;
            }
        }
    }
}